

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

uchar jsteemann::atoi_unchecked<unsigned_char>(char *p,char *e)

{
  char *e_local;
  char *p_local;
  
  if (p == e) {
    p_local._7_1_ = '\0';
  }
  else if (*p == '-') {
    p_local._7_1_ = '\0';
  }
  else {
    e_local = p;
    if (*p == '+') {
      e_local = p + 1;
    }
    p_local._7_1_ = atoi_positive_unchecked<unsigned_char>(e_local,e);
  }
  return p_local._7_1_;
}

Assistant:

inline T atoi_unchecked(char const* p, char const* e) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    return T();
  }

  if (*p == '-') {
    if (!std::is_signed<T>::value) {
      return T();
    }
    return atoi_negative_unchecked<T>(++p, e);
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive_unchecked<T>(p, e);
}